

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O0

void __thiscall Mat::Mat(Mat *this,Mat *rhs)

{
  undefined1 auVar1 [16];
  ulong uVar2;
  double *local_48;
  int local_30;
  int i;
  Mat *rhs_local;
  Mat *this_local;
  
  this->n_rows_ = rhs->n_rows_;
  this->n_cols_ = rhs->n_cols_;
  if (this->n_rows_ < 1) {
    local_48 = (double *)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = (long)(this->n_rows_ * this->n_cols_);
    uVar2 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar2 = 0xffffffffffffffff;
    }
    local_48 = (double *)operator_new__(uVar2);
  }
  this->v_ = local_48;
  for (local_30 = 0; local_30 < this->n_rows_ * this->n_cols_; local_30 = local_30 + 1) {
    this->v_[local_30] = rhs->v_[local_30];
  }
  return;
}

Assistant:

Mat::Mat(const Mat &rhs) : n_rows_(rhs.n_rows_),n_cols_(rhs.n_cols_), v_(n_rows_>0 ? new double[n_rows_*n_cols_] : NULL)
{
	for (int i=0; i<n_rows_*n_cols_; i++)
		v_[i] = rhs.v_[i];
}